

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1523::run(TestCase1523 *this)

{
  bool bVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  Type *func;
  Type *func_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ReaderOptions options;
  bool local_6d9;
  undefined1 *puStack_6d8;
  bool _kj_shouldLog_3;
  undefined1 *local_6d0;
  Maybe<kj::Exception> local_6c8;
  undefined1 local_568 [8];
  MallocMessageBuilder copy;
  undefined1 *puStack_470;
  bool _kj_shouldLog_2;
  Maybe<kj::Exception> local_468;
  Reader local_308;
  undefined1 local_2d8 [8];
  Reader root;
  undefined1 local_298 [8];
  SegmentArrayMessageReader reader;
  size_t local_1a8;
  bool local_199;
  size_t sStack_198;
  bool _kj_shouldLog_1;
  int local_190;
  bool local_189;
  undefined1 auStack_188 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  Builder local_140;
  Builder local_118;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  TestCase1523 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&local_140,(MessageBuilder *)local_100);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField(&local_118,&local_140);
  AnyPointer::Builder::initAs<capnp::List<capnp::Void,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<capnp::Void,_(capnp::Kind)0>_> *)&segments.size_,&local_118,
             0x10000000);
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  _auStack_188 = AVar4.ptr;
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_188);
  if (sVar2 != 1) {
    local_189 = kj::_::Debug::shouldLog(ERROR);
    while (local_189 != false) {
      local_190 = 1;
      sStack_198 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                             ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_188);
      kj::_::Debug::log<char_const(&)[42],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5f8,ERROR,
                 "\"failed: expected \" \"(1) == (segments.size())\", 1, segments.size()",
                 (char (*) [42])"failed: expected (1) == (segments.size())",&local_190,
                 &stack0xfffffffffffffe68);
      local_189 = false;
    }
  }
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_188,0);
  sVar2 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
  if (0xf < sVar2) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_188,0);
      local_1a8 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
      reader.segments.size_._4_4_ = 0x10;
      kj::_::Debug::log<char_const(&)[45],unsigned_long,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5f9,ERROR,
                 "\"failed: expected \" \"(segments[0].size()) < (16)\", segments[0].size(), 16",
                 (char (*) [45])"failed: expected (segments[0].size()) < (16)",&local_1a8,
                 (int *)((long)&reader.segments.size_ + 4));
      local_199 = false;
    }
  }
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  root.reader.nestingLimit = 0;
  root.reader._28_4_ = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&root.reader.nestingLimit);
  options._8_8_ = 0;
  options.traversalLimitInWords = root.reader._24_8_;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_298,AVar4,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&local_308,(MessageReader *)local_298);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            ((Reader *)local_2d8,&local_308);
  puStack_470 = local_2d8;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1523::run()::__0>
            (&local_468,(kj *)&stack0xfffffffffffffb90,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_468,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_468);
  if (!bVar1) {
    copy.moreSegments.builder.disposer._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)copy.moreSegments.builder.disposer._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[99]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x5fd,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr\""
                 ,(char (*) [99])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr"
                );
      copy.moreSegments.builder.disposer._7_1_ = false;
    }
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_568,0x400,GROW_HEURISTICALLY);
  puStack_6d8 = local_568;
  local_6d0 = local_298;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1523::run()::__1>
            (&local_6c8,(kj *)&stack0xfffffffffffff928,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_6c8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_6c8);
  if (!bVar1) {
    local_6d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6d9 != false) {
      kj::_::Debug::log<char_const(&)[109]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x600,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr\""
                 ,(char (*) [109])
                  "failed: expected kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr"
                );
      local_6d9 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_568);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_298);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
  return;
}

Assistant:

TEST(Encoding, VoidListAmplification) {
  MallocMessageBuilder builder;
  builder.initRoot<test::TestAnyPointer>().getAnyPointerField().initAs<List<Void>>(1u << 28);

  auto segments = builder.getSegmentsForOutput();
  EXPECT_EQ(1, segments.size());
  EXPECT_LT(segments[0].size(), 16);  // quite small for such a big list!

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());
  auto root = reader.getRoot<test::TestAnyPointer>().getAnyPointerField();
  EXPECT_NONFATAL_FAILURE(root.getAs<List<TestAllTypes>>());

  MallocMessageBuilder copy;
  EXPECT_NONFATAL_FAILURE(copy.setRoot(reader.getRoot<AnyPointer>()));
}